

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TestCaseTracking::ITracker::~ITracker(ITracker *this)

{
  this->_vptr_ITracker = (_func_int **)&PTR__ITracker_001aa408;
  std::
  vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::~vector(&this->m_children);
  std::__cxx11::string::~string((string *)&this->m_nameAndLocation);
  return;
}

Assistant:

ITracker::~ITracker() = default;